

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMReader.cc
# Opt level: O0

bool __thiscall OpenMesh::IO::_OMReader_::can_u_read(_OMReader_ *this,istream *_is)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  Header *hdr;
  undefined1 local_58 [8];
  undefined1 local_50 [8];
  reverse_iterator it;
  undefined1 local_38 [8];
  vector<char,_std::allocator<char>_> evt;
  istream *_is_local;
  _OMReader_ *this_local;
  
  evt.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = _is;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_38);
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)local_38,0x14);
  while (sVar3 = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)local_38), sVar3 < 4) {
    it.current._M_current._3_1_ = std::istream::get();
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)local_38,
               (value_type_conflict4 *)((long)&it.current._M_current + 3));
  }
  std::vector<char,_std::allocator<char>_>::rbegin((vector<char,_std::allocator<char>_> *)local_50);
  while( true ) {
    std::vector<char,_std::allocator<char>_>::rend((vector<char,_std::allocator<char>_> *)local_58);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                             *)local_50,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                             *)local_58);
    uVar1 = evt.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
    if (!bVar2) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                  *)&hdr,(int)local_50);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
    ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
                 *)&hdr);
    std::istream::putback((char)uVar1);
  }
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[]
                     ((vector<char,_std::allocator<char>_> *)local_38,0);
  if ((*pvVar4 == 'O') && (pvVar4[1] == 'M')) {
    if (((byte)pvVar4[2] - 0x50 < 2) || ((byte)pvVar4[2] == 0x54)) {
      this_local._7_1_ = supports(this,pvVar4[3]);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_38)
  ;
  return this_local._7_1_;
}

Assistant:

bool _OMReader_::can_u_read(std::istream& _is) const
{
  std::vector<char> evt;
  evt.reserve(20);

  // read first 4 characters into a buffer
  while (evt.size() < 4)
    evt.push_back(static_cast<char>(_is.get()));

  // put back all read characters
  std::vector<char>::reverse_iterator it = evt.rbegin();
  while (it != evt.rend())
    _is.putback(*it++);

  // evaluate header information
  OMFormat::Header *hdr = (OMFormat::Header*) &evt[0];

  // first two characters must be 'OM'
  if (hdr->magic_[0] != 'O' || hdr->magic_[1] != 'M')
    return false;

  // 3rd characters defines the mesh type:
  switch (hdr->mesh_) {
    case 'T': // Triangle Mesh
    case 'Q': // Quad Mesh
    case 'P': // Polygonal Mesh
      break;
    default:  // ?
      return false;
  }

  // 4th characters encodes the version
  return supports(hdr->version_);
}